

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topojson.cc
# Opt level: O1

void __thiscall topojson_t::make_coordinates(topojson_t *this,size_t topology_index)

{
  long *plVar1;
  pointer __x;
  uint uVar2;
  pointer pGVar3;
  pointer paVar4;
  long lVar5;
  long lVar6;
  iterator iVar7;
  int iVar8;
  undefined8 uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  pointer ptVar13;
  pointer ptVar14;
  pointer ptVar15;
  ulong uVar16;
  ulong uVar17;
  pointer ptVar18;
  pointer ptVar19;
  long lVar20;
  vector<double,_std::allocator<double>_> xp;
  vector<double,_std::allocator<double>_> yp;
  double position [2];
  Geometry_t geometry;
  Polygon_topojson_t polygon;
  arc_t arc;
  void *local_168;
  iterator iStack_160;
  double *local_158;
  void *local_148;
  iterator iStack_140;
  double *local_138;
  uint local_12c;
  pointer local_128;
  double local_120 [2];
  pointer local_110;
  pointer local_108;
  pointer local_100;
  double local_f8;
  double local_f0;
  long *local_e8 [2];
  long local_d8 [2];
  vector<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_> local_c8;
  vector<int,_std::allocator<int>_> local_b0;
  vector<double,_std::allocator<double>_> local_98;
  vector<double,_std::allocator<double>_> local_80;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_68;
  pointer local_50;
  undefined1 *local_48;
  ulong local_40;
  ulong local_38;
  
  ptVar15 = (this->m_topology).
            super__Vector_base<topology_object_t,_std::allocator<topology_object_t>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar12 = ((long)(this->m_topology).
                  super__Vector_base<topology_object_t,_std::allocator<topology_object_t>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)ptVar15 >> 3) * 0x6db6db6db6db6db7;
  ptVar19 = (pointer)topology_index;
  if (uVar12 < topology_index || uVar12 - topology_index == 0) {
LAB_0010634e:
    uVar9 = std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       ptVar19);
    if (local_e8[0] != local_d8) {
      operator_delete(local_e8[0],local_d8[0] + 1);
    }
    _Unwind_Resume(uVar9);
  }
  pGVar3 = *(pointer *)
            ((long)&ptVar15[topology_index].m_geom.
                    super__Vector_base<Geometry_t,_std::allocator<Geometry_t>_> + 8);
  lVar10 = *(long *)&ptVar15[topology_index].m_geom.
                     super__Vector_base<Geometry_t,_std::allocator<Geometry_t>_>;
  this->idx_geom = 0;
  lVar10 = (long)pGVar3 - lVar10;
  if (lVar10 != 0) {
    local_50 = (pointer)((lVar10 >> 3) * 0x6db6db6db6db6db7);
    ptVar18 = (pointer)0x0;
    ptVar15 = (pointer)topology_index;
    local_110 = (pointer)topology_index;
    do {
      ptVar14 = (this->m_topology).
                super__Vector_base<topology_object_t,_std::allocator<topology_object_t>_>._M_impl.
                super__Vector_impl_data._M_start;
      ptVar13 = (pointer)(((long)(this->m_topology).
                                 super__Vector_base<topology_object_t,_std::allocator<topology_object_t>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)ptVar14 >> 3) *
                         0x6db6db6db6db6db7);
      ptVar19 = ptVar15;
      if ((ptVar13 < ptVar15 || (long)ptVar13 - (long)ptVar15 == 0) ||
         (lVar10 = *(long *)&ptVar14[topology_index].m_geom.
                             super__Vector_base<Geometry_t,_std::allocator<Geometry_t>_>,
         ptVar14 = (pointer)(((long)*(pointer *)
                                     ((long)&ptVar14[topology_index].m_geom.
                                             super__Vector_base<Geometry_t,_std::allocator<Geometry_t>_>
                                     + 8) - lVar10 >> 3) * 0x6db6db6db6db6db7), ptVar19 = ptVar18,
         ptVar14 < ptVar18 || (long)ptVar14 - (long)ptVar18 == 0)) goto LAB_0010634e;
      local_e8[0] = local_d8;
      plVar1 = (long *)(lVar10 + (long)ptVar18 * 0x38);
      std::__cxx11::string::_M_construct<char*>((string *)local_e8,*plVar1,plVar1[1] + *plVar1);
      std::vector<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>::vector
                (&local_c8,
                 (vector<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_> *)(plVar1 + 4));
      iVar8 = std::__cxx11::string::compare((char *)local_e8);
      if (((iVar8 == 0) ||
          (iVar8 = std::__cxx11::string::compare((char *)local_e8), ptVar19 = ptVar15, iVar8 == 0))
         && (ptVar19 = ptVar15,
            (long)local_c8.
                  super__Vector_base<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_c8.
                  super__Vector_base<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>.
                  _M_impl.super__Vector_impl_data._M_start != 0)) {
        lVar10 = ((long)local_c8.
                        super__Vector_base<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_c8.
                        super__Vector_base<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
        local_48 = (undefined1 *)(lVar10 + (ulong)(lVar10 == 0));
        ptVar18 = (pointer)0x0;
        do {
          ptVar15 = (pointer)(((long)local_c8.
                                     super__Vector_base<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_c8.
                                     super__Vector_base<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x71c71c71c71c71c7);
          if (ptVar15 < ptVar18 || (long)ptVar15 - (long)ptVar18 == 0) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
            goto LAB_0010634e;
          }
          __x = local_c8.super__Vector_base<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>
                ._M_impl.super__Vector_impl_data._M_start + (long)ptVar18;
          std::vector<int,_std::allocator<int>_>::vector(&local_b0,&__x->arcs);
          std::vector<double,_std::allocator<double>_>::vector(&local_98,&__x->m_x);
          std::vector<double,_std::allocator<double>_>::vector(&local_80,&__x->m_y);
          if ((long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != 0) {
            lVar10 = (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2;
            local_40 = lVar10 + (ulong)(lVar10 == 0);
            uVar12 = 0;
            do {
              if ((ulong)((long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start >> 2) <= uVar12) {
LAB_001062fd:
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar12);
LAB_0010630e:
                __assert_fail("xp.size() == size_vec_arcs",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/pedro-vicente[P]lib_topojson/topojson.cc"
                              ,0x1fe,"void topojson_t::make_coordinates(size_t)");
              }
              uVar2 = local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar12];
              uVar17 = (ulong)(int)((int)uVar2 >> 0x1f ^ uVar2);
              paVar4 = (this->m_arcs).super__Vector_base<arc_t,_std::allocator<arc_t>_>._M_impl.
                       super__Vector_impl_data._M_start;
              uVar16 = ((long)(this->m_arcs).super__Vector_base<arc_t,_std::allocator<arc_t>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)paVar4 >> 3) *
                       -0x5555555555555555;
              if (uVar16 < uVar17 || uVar16 - uVar17 == 0) {
LAB_001062ef:
                std::__throw_out_of_range_fmt
                          (
                          "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                          );
                goto LAB_001062fd;
              }
              std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::vector(&local_68,&paVar4[uVar17].vec);
              lVar10 = (long)local_68.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_68.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3;
              lVar11 = lVar10 * -0x5555555555555555;
              local_158 = (double *)0x0;
              local_168 = (void *)0x0;
              iStack_160._M_current = (double *)0x0;
              local_138 = (double *)0x0;
              local_148 = (void *)0x0;
              iStack_140._M_current = (double *)0x0;
              local_100 = (pointer)local_68.
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
              local_108 = (pointer)local_68.
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
              local_12c = uVar2;
              local_38 = uVar12;
              if (local_68.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  local_68.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                local_f0 = 0.0;
                lVar20 = 8;
                uVar12 = 0;
                local_f8 = 0.0;
                do {
                  uVar16 = ((long)local_68.
                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_68.
                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                           -0x5555555555555555;
                  ptVar15 = (pointer)local_68.
                                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                  if (uVar16 < uVar12 || uVar16 - uVar12 == 0) goto LAB_001062c5;
                  ptVar19 = *(pointer *)
                             ((long)local_68.
                                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar20 + -8);
                  ptVar15 = *(pointer *)
                             ((long)&(((string *)
                                      &(local_68.
                                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                       super__Vector_base<double,_std::allocator<double>_>)->
                                     _M_dataplus)._M_p + lVar20);
                  if (ptVar15 == ptVar19) {
                    uVar12 = 0;
                    goto LAB_001062c5;
                  }
                  local_128 = (pointer)(ptVar19->name)._M_dataplus._M_p;
                  if ((ulong)((long)ptVar15 - (long)ptVar19 >> 3) < 2) goto LAB_001062bc;
                  local_f8 = local_f8 + (double)local_128;
                  local_128 = (pointer)(this->scale[0] * local_f8 + this->translate[0]);
                  local_f0 = local_f0 + (double)(ptVar19->name)._M_string_length;
                  local_120[0] = this->scale[1] * local_f0 + this->translate[1];
                  if (iStack_160._M_current == local_158) {
                    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                              ((vector<double,std::allocator<double>> *)&local_168,iStack_160,
                               (double *)&local_128);
                  }
                  else {
                    *iStack_160._M_current = (double)local_128;
                    iStack_160._M_current = iStack_160._M_current + 1;
                  }
                  if (iStack_140._M_current == local_138) {
                    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                              ((vector<double,std::allocator<double>> *)&local_148,iStack_140,
                               local_120);
                  }
                  else {
                    *iStack_140._M_current = local_120[0];
                    iStack_140._M_current = iStack_140._M_current + 1;
                  }
                  uVar12 = uVar12 + 1;
                  lVar20 = lVar20 + 0x18;
                } while (lVar11 + (ulong)(lVar11 == 0) != uVar12);
              }
              ptVar19 = local_110;
              if ((int)local_12c < 0) {
                if (local_108 != local_100) {
                  uVar12 = lVar11 + (ulong)(lVar11 == 0);
                  lVar10 = lVar10 * 0x5555555555555558;
                  do {
                    lVar10 = lVar10 + -8;
                    ptVar14 = (this->m_topology).
                              super__Vector_base<topology_object_t,_std::allocator<topology_object_t>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    ptVar13 = (pointer)(((long)(this->m_topology).
                                               super__Vector_base<topology_object_t,_std::allocator<topology_object_t>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)ptVar14 >> 3) * 0x6db6db6db6db6db7);
                    ptVar15 = ptVar19;
                    if (ptVar13 < ptVar19 || (long)ptVar13 - (long)ptVar19 == 0) goto LAB_001062de;
                    ptVar15 = (pointer)this->idx_geom;
                    lVar20 = *(long *)&ptVar14[topology_index].m_geom.
                                       super__Vector_base<Geometry_t,_std::allocator<Geometry_t>_>;
                    ptVar14 = (pointer)(((long)*(pointer *)
                                                ((long)&ptVar14[topology_index].m_geom.
                                                                                                                
                                                  super__Vector_base<Geometry_t,_std::allocator<Geometry_t>_>
                                                + 8) - lVar20 >> 3) * 0x6db6db6db6db6db7);
                    if ((ptVar14 < ptVar15 || (long)ptVar14 - (long)ptVar15 == 0) ||
                       (lVar5 = *(long *)(lVar20 + 0x20 + (long)ptVar15 * 0x38),
                       ptVar14 = (pointer)((*(long *)(lVar20 + 0x28 + (long)ptVar15 * 0x38) - lVar5
                                           >> 3) * -0x71c71c71c71c71c7), ptVar15 = ptVar18,
                       ptVar14 < ptVar18 || (long)ptVar14 - (long)ptVar18 == 0)) goto LAB_001062de;
                    lVar5 = lVar5 + (long)ptVar18 * 0x48;
                    iVar7._M_current = *(double **)(lVar5 + 0x20);
                    if (iVar7._M_current == *(double **)(lVar5 + 0x28)) {
                      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                                ((vector<double,std::allocator<double>> *)(lVar5 + 0x18),iVar7,
                                 (double *)((long)local_168 + lVar10));
                    }
                    else {
                      *iVar7._M_current = *(double *)((long)local_168 + lVar10);
                      *(double **)(lVar5 + 0x20) = iVar7._M_current + 1;
                    }
                    ptVar14 = (this->m_topology).
                              super__Vector_base<topology_object_t,_std::allocator<topology_object_t>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    ptVar13 = (pointer)(((long)(this->m_topology).
                                               super__Vector_base<topology_object_t,_std::allocator<topology_object_t>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)ptVar14 >> 3) * 0x6db6db6db6db6db7);
                    ptVar15 = ptVar19;
                    if (ptVar13 < ptVar19 || (long)ptVar13 - (long)ptVar19 == 0) goto LAB_001062de;
                    ptVar15 = (pointer)this->idx_geom;
                    lVar20 = *(long *)&ptVar14[topology_index].m_geom.
                                       super__Vector_base<Geometry_t,_std::allocator<Geometry_t>_>;
                    ptVar14 = (pointer)(((long)*(pointer *)
                                                ((long)&ptVar14[topology_index].m_geom.
                                                                                                                
                                                  super__Vector_base<Geometry_t,_std::allocator<Geometry_t>_>
                                                + 8) - lVar20 >> 3) * 0x6db6db6db6db6db7);
                    if ((ptVar14 < ptVar15 || (long)ptVar14 - (long)ptVar15 == 0) ||
                       (lVar5 = *(long *)(lVar20 + 0x20 + (long)ptVar15 * 0x38),
                       ptVar14 = (pointer)((*(long *)(lVar20 + 0x28 + (long)ptVar15 * 0x38) - lVar5
                                           >> 3) * -0x71c71c71c71c71c7), ptVar15 = ptVar18,
                       ptVar14 < ptVar18 || (long)ptVar14 - (long)ptVar18 == 0)) goto LAB_001062de;
                    lVar5 = lVar5 + (long)ptVar18 * 0x48;
                    iVar7._M_current = *(double **)(lVar5 + 0x38);
                    if (iVar7._M_current == *(double **)(lVar5 + 0x40)) {
                      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                                ((vector<double,std::allocator<double>> *)(lVar5 + 0x30),iVar7,
                                 (double *)((long)local_148 + lVar10));
                    }
                    else {
                      *iVar7._M_current = *(double *)((long)local_148 + lVar10);
                      *(double **)(lVar5 + 0x38) = iVar7._M_current + 1;
                    }
                    uVar12 = uVar12 - 1;
                  } while (uVar12 != 0);
                }
              }
              else if (local_108 != local_100) {
                lVar10 = lVar11 + (ulong)(lVar11 == 0);
                lVar20 = 0;
                do {
                  ptVar15 = (this->m_topology).
                            super__Vector_base<topology_object_t,_std::allocator<topology_object_t>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  ptVar13 = (pointer)(((long)(this->m_topology).
                                             super__Vector_base<topology_object_t,_std::allocator<topology_object_t>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)ptVar15 >> 3) * 0x6db6db6db6db6db7);
                  ptVar14 = ptVar19;
                  if (ptVar13 < ptVar19 || (long)ptVar13 - (long)ptVar19 == 0) {
LAB_001062ab:
                    std::__throw_out_of_range_fmt
                              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                               ,ptVar14);
LAB_001062bc:
                    uVar12 = 1;
LAB_001062c5:
                    std::__throw_out_of_range_fmt
                              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                               ,uVar12);
LAB_001062de:
                    std::__throw_out_of_range_fmt
                              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                               ,ptVar15);
                    goto LAB_001062ef;
                  }
                  ptVar14 = (pointer)this->idx_geom;
                  lVar5 = *(long *)&ptVar15[topology_index].m_geom.
                                    super__Vector_base<Geometry_t,_std::allocator<Geometry_t>_>;
                  ptVar13 = (pointer)(((long)*(pointer *)
                                              ((long)&ptVar15[topology_index].m_geom.
                                                                                                            
                                                  super__Vector_base<Geometry_t,_std::allocator<Geometry_t>_>
                                              + 8) - lVar5 >> 3) * 0x6db6db6db6db6db7);
                  if ((ptVar13 < ptVar14 || (long)ptVar13 - (long)ptVar14 == 0) ||
                     (lVar6 = *(long *)(lVar5 + ((long)ptVar14 * 7 + 4) * 8),
                     ptVar13 = (pointer)((*(long *)(lVar5 + ((long)ptVar14 * 7 + 5) * 8) - lVar6 >>
                                         3) * -0x71c71c71c71c71c7), ptVar15 = ptVar18,
                     ptVar14 = ptVar18, ptVar13 < ptVar18 || (long)ptVar13 - (long)ptVar18 == 0))
                  goto LAB_001062ab;
                  lVar6 = lVar6 + (long)ptVar18 * 0x48;
                  iVar7._M_current = *(double **)(lVar6 + 0x20);
                  if (iVar7._M_current == *(double **)(lVar6 + 0x28)) {
                    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                              ((vector<double,std::allocator<double>> *)(lVar6 + 0x18),iVar7,
                               (double *)((long)local_168 + lVar20));
                  }
                  else {
                    *iVar7._M_current = *(double *)((long)local_168 + lVar20);
                    *(double **)(lVar6 + 0x20) = iVar7._M_current + 1;
                  }
                  ptVar15 = (this->m_topology).
                            super__Vector_base<topology_object_t,_std::allocator<topology_object_t>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  ptVar13 = (pointer)(((long)(this->m_topology).
                                             super__Vector_base<topology_object_t,_std::allocator<topology_object_t>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)ptVar15 >> 3) * 0x6db6db6db6db6db7);
                  ptVar14 = ptVar19;
                  if (ptVar13 < ptVar19 || (long)ptVar13 - (long)ptVar19 == 0) goto LAB_001062ab;
                  ptVar14 = (pointer)this->idx_geom;
                  lVar5 = *(long *)&ptVar15[topology_index].m_geom.
                                    super__Vector_base<Geometry_t,_std::allocator<Geometry_t>_>;
                  ptVar13 = (pointer)(((long)*(pointer *)
                                              ((long)&ptVar15[topology_index].m_geom.
                                                                                                            
                                                  super__Vector_base<Geometry_t,_std::allocator<Geometry_t>_>
                                              + 8) - lVar5 >> 3) * 0x6db6db6db6db6db7);
                  if ((ptVar13 < ptVar14 || (long)ptVar13 - (long)ptVar14 == 0) ||
                     (lVar6 = *(long *)(lVar5 + ((long)ptVar14 * 7 + 4) * 8),
                     ptVar13 = (pointer)((*(long *)(lVar5 + ((long)ptVar14 * 7 + 5) * 8) - lVar6 >>
                                         3) * -0x71c71c71c71c71c7), ptVar15 = ptVar18,
                     ptVar14 = ptVar18, ptVar13 < ptVar18 || (long)ptVar13 - (long)ptVar18 == 0))
                  goto LAB_001062ab;
                  lVar6 = lVar6 + (long)ptVar18 * 0x48;
                  iVar7._M_current = *(double **)(lVar6 + 0x38);
                  if (iVar7._M_current == *(double **)(lVar6 + 0x40)) {
                    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                              ((vector<double,std::allocator<double>> *)(lVar6 + 0x30),iVar7,
                               (double *)((long)local_148 + lVar20));
                  }
                  else {
                    *iVar7._M_current = *(double *)((long)local_148 + lVar20);
                    *(double **)(lVar6 + 0x38) = iVar7._M_current + 1;
                  }
                  lVar20 = lVar20 + 8;
                  lVar10 = lVar10 + -1;
                } while (lVar10 != 0);
              }
              if ((long)iStack_160._M_current - (long)local_168 >> 3 != lVar11) goto LAB_0010630e;
              if (local_148 != (void *)0x0) {
                operator_delete(local_148,(long)local_138 - (long)local_148);
              }
              uVar12 = local_38;
              if (local_168 != (void *)0x0) {
                operator_delete(local_168,(long)local_158 - (long)local_168);
              }
              std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::~vector(&local_68);
              uVar12 = uVar12 + 1;
            } while (uVar12 != local_40);
          }
          if (local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_80.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_80.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_98.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_98.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if (local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          ptVar18 = (pointer)((long)&(ptVar18->name)._M_dataplus._M_p + 1);
        } while (ptVar18 != (pointer)local_48);
      }
      std::vector<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>::~vector(&local_c8);
      if (local_e8[0] != local_d8) {
        operator_delete(local_e8[0],local_d8[0] + 1);
      }
      ptVar18 = (pointer)(this->idx_geom + 1);
      this->idx_geom = (size_t)ptVar18;
      ptVar15 = ptVar19;
    } while (ptVar18 < local_50);
  }
  return;
}

Assistant:

void topojson_t::make_coordinates(size_t topology_index)
{
  size_t size_geom = m_topology.at(topology_index).m_geom.size();
  for (idx_geom = 0; idx_geom < size_geom; idx_geom++)
  {
    Geometry_t geometry = m_topology.at(topology_index).m_geom.at(idx_geom);
    if (geometry.type.compare("Polygon") == 0 || geometry.type.compare("MultiPolygon") == 0)
    {
      size_t size_pol = geometry.m_polygon.size();
      for (size_t idx_pol = 0; idx_pol < size_pol; idx_pol++)
      {
        Polygon_topojson_t polygon = geometry.m_polygon.at(idx_pol);
        size_t size_arcs = polygon.arcs.size();

        for (size_t idx_arc = 0; idx_arc < size_arcs; idx_arc++)
        {
          int index = polygon.arcs.at(idx_arc);
          int index_q = index < 0 ? ~index : index;
          arc_t arc = m_arcs.at(index_q);
          size_t size_vec_arcs = arc.vec.size();
          //if a topology is quantized, the positions of each arc in the topology which are quantized 
          //must be delta-encoded. The first position of the arc is a normal position [x1, y1]. 
          //The second position [x2, y2] is encoded as [dx2, dy2], where 
          //x2 = x1 + dx2 and 
          //y2 = y1 + dx2.
          //The third position [x3, y3] is encoded as [dx3, dy3], where 
          //x3 = x2 + dx3 = x1 + dx2 + dx3 and
          //y3 = y2 + dy3 = y1 + dy2 + dy3 and so on.
          double x = 0;
          double y = 0;
          //temporary positions
          std::vector<double> xp;
          std::vector<double> yp;
          for (size_t idx = 0; idx < size_vec_arcs; idx++)
          {
            double position[2];
            position[0] = arc.vec.at(idx).at(0);
            position[1] = arc.vec.at(idx).at(1);
            position[0] = (x += position[0]) * scale[0] + translate[0];
            position[1] = (y += position[1]) * scale[1] + translate[1];
            xp.push_back(position[0]);
            yp.push_back(position[1]);
          }//size_vec_arcs

          //@mbostock
          //TopoJSON allows you to reference a reversed arc in a geometry so that when geometries share an arc, 
          //but some geometries need the arc in the opposite direction, the geometries can reference the same arc.
          //This occurs very commonly when you have neighboring geometries.For example, California and Nevada 
          //share a border, but given that both would typically have the same winding order, 
          //the shared border must be reversed between the two polygons if you want to share the arc.
          //A reversed arc means that rather than the arc�s points going p_0, p_1, � p_n, 
          //the points go p_n, p_{ n - 1 }, � p_0.

           //reverse the subsequences of points represented by the negative arc indexes
          if (index < 0)
          {
            for (size_t idx = 0; idx < size_vec_arcs; idx++)
            {
              size_t jdx = size_vec_arcs - idx - 1;
              m_topology.at(topology_index).m_geom.at(idx_geom).m_polygon.at(idx_pol).m_x.push_back(xp[jdx]);
              m_topology.at(topology_index).m_geom.at(idx_geom).m_polygon.at(idx_pol).m_y.push_back(yp[jdx]);
            }
          }
          //do not reverse
          else
          {
            for (size_t idx = 0; idx < size_vec_arcs; idx++)
            {
              size_t jdx = idx;
              m_topology.at(topology_index).m_geom.at(idx_geom).m_polygon.at(idx_pol).m_x.push_back(xp[jdx]);
              m_topology.at(topology_index).m_geom.at(idx_geom).m_polygon.at(idx_pol).m_y.push_back(yp[jdx]);
            }
          }
          assert(xp.size() == size_vec_arcs);

        }//size_arcs
      }//size_pol
    }//"Polygon"
  }//size_geom
}